

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O3

Variable __thiscall
LiteScript::_Type_CHARACTER::OAdd(_Type_CHARACTER *this,Variable *obj1,Variable *obj2)

{
  Character *pCVar1;
  bool bVar2;
  Object *pOVar3;
  Type *pTVar4;
  Type *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *extraout_RDX_01;
  uint *puVar5;
  Variable VVar6;
  Variable tmp;
  String local_58;
  Variable local_38;
  
  pOVar3 = Variable::operator->((Variable *)in_RCX);
  pTVar4 = Object::GetType(pOVar3);
  bVar2 = Type::operator!=(pTVar4,(Type *)_type_string);
  if (bVar2) {
    Variable::Convert(&local_38,in_RCX);
    pOVar3 = Variable::operator->(&local_38);
    pTVar4 = Object::GetType(pOVar3);
    bVar2 = Type::operator!=(pTVar4,(Type *)_type_string);
    if (bVar2) {
      pOVar3 = Variable::operator->(obj2);
      Memory::Create((Memory *)this,(Type *)pOVar3->memory);
    }
    else {
      pOVar3 = Variable::operator->(obj2);
      Memory::Create((Memory *)this,(Type *)pOVar3->memory);
      pOVar3 = Variable::operator->(obj2);
      pCVar1 = (Character *)pOVar3->data;
      pOVar3 = Variable::operator->(&local_38);
      Character::operator+(&local_58,pCVar1,(String *)pOVar3->data);
      pOVar3 = Variable::operator->((Variable *)this);
      String::operator=((String *)pOVar3->data,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
           *)local_58.str._M_dataplus._M_p != &local_58.str.field_2) {
        operator_delete(local_58.str._M_dataplus._M_p);
      }
    }
    Variable::~Variable(&local_38);
    puVar5 = extraout_RDX_01;
  }
  else {
    pOVar3 = Variable::operator->(obj2);
    Memory::Create((Memory *)this,(Type *)pOVar3->memory);
    pOVar3 = Variable::operator->(obj2);
    pCVar1 = (Character *)pOVar3->data;
    pOVar3 = Variable::operator->((Variable *)in_RCX);
    Character::operator+(&local_58,pCVar1,(String *)pOVar3->data);
    pOVar3 = Variable::operator->((Variable *)this);
    String::operator=((String *)pOVar3->data,&local_58);
    puVar5 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_58.str._M_dataplus._M_p != &local_58.str.field_2) {
      operator_delete(local_58.str._M_dataplus._M_p);
      puVar5 = extraout_RDX_00;
    }
  }
  VVar6.nb_ref = puVar5;
  VVar6.obj = (Object *)this;
  return VVar6;
}

Assistant:

LiteScript::Variable LiteScript::_Type_CHARACTER::OAdd(const LiteScript::Variable& obj1, const LiteScript::Variable& obj2) const {
    if (obj2->GetType() != Type::STRING) {
        Variable tmp = obj2.Convert(Type::STRING);
        if (tmp->GetType() != Type::STRING)
            return obj1->memory.Create(Type::NIL);
        Variable res = obj1->memory.Create(Type::STRING);
        res->GetData<String>() = obj1->GetData<Character>() + tmp->GetData<String>();
        return res;
    }
    Variable res = obj1->memory.Create(Type::STRING);
    res->GetData<String>() = obj1->GetData<Character>() + obj2->GetData<String>();
    return res;
}